

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int32_t interleavedBinarySearch(rle16_t *array,int32_t lenarray,uint16_t ikey)

{
  bool bVar1;
  uint in_EAX;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  iVar2 = lenarray + -1;
  uVar4 = 0;
  do {
    if (iVar2 < (int)uVar4) {
      return ~uVar4;
    }
    uVar3 = uVar4 + iVar2 >> 1;
    if (array[uVar3].value < ikey) {
      uVar4 = uVar3 + 1;
      bVar1 = true;
      uVar3 = in_EAX;
    }
    else if (ikey < array[uVar3].value) {
      iVar2 = uVar3 - 1;
      bVar1 = true;
      uVar3 = in_EAX;
    }
    else {
      bVar1 = false;
    }
    in_EAX = uVar3;
  } while (bVar1);
  return uVar3;
}

Assistant:

inline int32_t interleavedBinarySearch(const rle16_t *array, int32_t lenarray,
                                       uint16_t ikey) {
    int32_t low = 0;
    int32_t high = lenarray - 1;
    while (low <= high) {
        int32_t middleIndex = (low + high) >> 1;
        uint16_t middleValue = array[middleIndex].value;
        if (middleValue < ikey) {
            low = middleIndex + 1;
        } else if (middleValue > ikey) {
            high = middleIndex - 1;
        } else {
            return middleIndex;
        }
    }
    return -(low + 1);
}